

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O0

int __thiscall BOCC_CTA::begin_trans(BOCC_CTA *this)

{
  Transaction *this_00;
  mapped_type *ppTVar1;
  rep rVar2;
  int local_14;
  BOCC_CTA *pBStack_10;
  int id;
  BOCC_CTA *this_local;
  
  pBStack_10 = this;
  std::shared_mutex::lock(&this->scheduler_lock);
  local_14 = this->counter;
  this_00 = (Transaction *)operator_new(0xc0);
  Transaction::Transaction(this_00,local_14,this->M);
  ppTVar1 = std::
            unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&local_14);
  *ppTVar1 = this_00;
  rVar2 = std::chrono::_V2::system_clock::now();
  ppTVar1 = std::
            unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&local_14);
  ((*ppTVar1)->start_time).__d.__r = rVar2;
  this->counter = this->counter + 1;
  std::shared_mutex::unlock(&this->scheduler_lock);
  return local_14;
}

Assistant:

int BOCC_CTA::begin_trans() {
    scheduler_lock.lock();

    //if(transactions.size()>FOCC_OTA_GARB_THRESH) garbageCollect();

    int id = counter;
    transactions[id] = new Transaction(id, M);
    transactions[id]->start_time = std::chrono::high_resolution_clock::now();
    counter++;
    scheduler_lock.unlock();

    return id;
}